

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

char * skip_identifier(char *str)

{
  ushort **ppuVar1;
  char *in_RDI;
  bool bVar2;
  char *local_10;
  char *local_8;
  
  ppuVar1 = __ctype_b_loc();
  if ((((*ppuVar1)[(int)*in_RDI] & 0x400) == 0) && (*in_RDI != '_')) {
    local_8 = (char *)0x0;
  }
  else {
    local_10 = in_RDI + 1;
    while( true ) {
      ppuVar1 = __ctype_b_loc();
      bVar2 = true;
      if (((*ppuVar1)[(int)*local_10] & 8) == 0) {
        bVar2 = *local_10 == '_';
      }
      if (!bVar2) break;
      local_10 = local_10 + 1;
    }
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

static const char* skip_identifier(const char* str)
{
    if(!isalpha(*str) && *str != '_')
        return NULL;
    else
    {
        ++str;
        for(; isalnum(*str) || *str == '_'; ++str) ;
        return str;
    }
}